

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_sah_builder.h
# Opt level: O1

optional<unsigned_long> __thiscall
bvh::v2::SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::try_split
          (SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this,BBox *bbox,size_t begin,
          size_t end)

{
  ulong *puVar1;
  pointer puVar2;
  _Bit_type *p_Var3;
  byte bVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  _Storage<unsigned_long,_true> _Var10;
  _Storage<unsigned_long,_true> extraout_RDX;
  undefined8 uVar11;
  size_t axis;
  size_t axis_00;
  ulong uVar12;
  Config *pCVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar14;
  size_t axis_1;
  ulong uVar15;
  undefined1 in_XMM4 [16];
  optional<unsigned_long> oVar16;
  Split best_split;
  undefined8 local_68;
  float local_60;
  _Storage<unsigned_long,_true> local_58;
  float local_50;
  ulong local_48;
  _Storage<unsigned_long,_true> local_40;
  ulong local_38;
  
  pCVar13 = (this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).config_;
  fVar5 = (bbox->max).values[0] - (bbox->min).values[0];
  fVar6 = (bbox->max).values[1] - (bbox->min).values[1];
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar6)),
                           ZEXT416((uint)((bbox->max).values[2] - (bbox->min).values[2])),
                           ZEXT416((uint)(fVar5 + fVar6)));
  local_38 = end - begin;
  auVar7 = vcvtusi2ss_avx512f(in_XMM4,(pCVar13->sah).prim_offset_ + local_38 >>
                                      ((ulong)(byte)(pCVar13->sah).log_cluster_size_ & 0x3f));
  fVar5 = auVar8._0_4_ * (auVar7._0_4_ - (pCVar13->sah).cost_ratio_);
  local_58._M_value = begin + 1 + end >> 1;
  local_48 = 0;
  axis_00 = 0;
  local_50 = fVar5;
  local_40._M_value = local_58._M_value;
  do {
    find_best_split(this,axis_00,begin,end,(Split *)&local_58);
    axis_00 = axis_00 + 1;
  } while (axis_00 != 3);
  if (fVar5 <= local_50) {
    local_58 = (_Storage<unsigned_long,_true>)
               (this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).config_;
    if (local_38 <= *(size_t *)(local_58._M_value + 0x20)) {
      uVar11 = 0;
      goto LAB_0010caee;
    }
    local_58._M_value = local_40._M_value;
    auVar7 = vinsertps_avx(ZEXT416((uint)((bbox->max).values[0] - (bbox->min).values[0])),
                           ZEXT416((uint)((bbox->max).values[1] - (bbox->min).values[1])),0x10);
    local_60 = (bbox->max).values[2] - (bbox->min).values[2];
    uVar11 = vmovlps_avx(auVar7);
    local_68 = uVar11;
    uVar11 = local_68;
    local_68._4_4_ = (float)((ulong)uVar11 >> 0x20);
    local_68._0_4_ = (float)uVar11;
    bVar9 = (float)local_68 < local_68._4_4_;
    local_68 = uVar11;
    local_48 = 2;
    if (local_60 <= *(float *)((long)&local_68 + (ulong)bVar9 * 4)) {
      local_48 = (ulong)bVar9;
    }
  }
  if (begin < local_58._M_value) {
    puVar2 = this->prim_ids_[local_48].
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var3 = (this->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    pCVar13 = (Config *)begin;
    do {
      uVar15 = puVar2[(long)pCVar13];
      uVar12 = uVar15 + 0x3f;
      if (-1 < (long)uVar15) {
        uVar12 = uVar15;
      }
      puVar1 = p_Var3 + ((long)uVar12 >> 6) +
                        (ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar1 = *puVar1 | 1L << (uVar15 & 0x3f);
      pCVar13 = (Config *)((long)&(pCVar13->sah).log_cluster_size_ + 1);
    } while ((Config *)local_58._M_value != pCVar13);
  }
  _Var10 = local_58;
  if (local_58._M_value < end) {
    puVar2 = this->prim_ids_[local_48].
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var3 = (this->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    do {
      uVar15 = puVar2[(long)_Var10];
      uVar12 = uVar15 + 0x3f;
      if (-1 < (long)uVar15) {
        uVar12 = uVar15;
      }
      bVar4 = (byte)uVar15 & 0x3f;
      puVar1 = p_Var3 + ((long)uVar12 >> 6) +
                        (ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      _Var10._M_value = _Var10._M_value + 1;
    } while (end != _Var10._M_value);
  }
  pvVar14 = this->prim_ids_;
  uVar15 = 0;
  do {
    if (uVar15 != local_48) {
      puVar2 = (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::
      __stable_partition<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_pred<bvh::v2::SweepSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::try_split(bvh::v2::BBox<float,3ul>const&,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(puVar2 + begin),
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(puVar2 + end),
                 (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_madmann91[P]bvh_src_bvh_v2_sweep_sah_builder_h:135:17)>
                  )this);
      _Var10 = extraout_RDX;
    }
    uVar15 = uVar15 + 1;
    pvVar14 = pvVar14 + 1;
  } while (uVar15 != 3);
  uVar11 = CONCAT71((int7)((ulong)_Var10 >> 8),1);
LAB_0010caee:
  oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar11;
  oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_58._M_value;
  return (optional<unsigned_long>)
         oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> try_split(const BBox& bbox, size_t begin, size_t end) override {
        // Find the best split over all axes
        auto leaf_cost = config_.sah.get_non_split_cost(begin, end, bbox);
        auto best_split = Split { (begin + end + 1) / 2, leaf_cost, 0 };
        for (size_t axis = 0; axis < Node::dimension; ++axis)
            find_best_split(axis, begin, end, best_split);

        // Make sure that the split is good before proceeding with it
        if (best_split.cost >= leaf_cost) {
            if (end - begin <= config_.max_leaf_size)
                return std::nullopt;

            // If the number of primitives is too high, fallback on a split at the
            // median on the largest axis.
            best_split.pos = (begin + end + 1) / 2;
            best_split.axis = bbox.get_diagonal().get_largest_axis();
        }

        // Partition primitives (keeping the order intact so that the next recursive calls do not
        // need to sort primitives again).
        mark_primitives(best_split.axis, begin, best_split.pos, end);
        for (size_t axis = 0; axis < Node::dimension; ++axis) {
            if (axis == best_split.axis)
                continue;
            std::stable_partition(
                prim_ids_[axis].begin() + begin,
                prim_ids_[axis].begin() + end,
                [&] (size_t i) { return marks_[i]; });
        }

        return std::make_optional(best_split.pos);
    }